

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LaneBasedExecutionQueue.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_4604bd::LaneBasedExecutionQueue::addJob
          (LaneBasedExecutionQueue *this,QueueJob *job,QueueJobPriority priority)

{
  Scheduler *pSVar1;
  QueueJob *pQVar2;
  QueueJob local_80;
  QueueJob local_58;
  
  std::mutex::lock(&this->readyJobsMutex);
  if (priority == High) {
    llbuild::basic::QueueJob::QueueJob(&local_58,job);
    std::deque<llbuild::basic::QueueJob,_std::allocator<llbuild::basic::QueueJob>_>::push_back
              (&(this->readyPriorityJobs).jobs,&local_58);
    if (local_58.work.super__Function_base._M_manager == (_Manager_type)0x0) goto LAB_001a1032;
    pQVar2 = &local_58;
  }
  else {
    pSVar1 = (this->readyJobs)._M_t.
             super___uniq_ptr_impl<(anonymous_namespace)::Scheduler,_std::default_delete<(anonymous_namespace)::Scheduler>_>
             ._M_t.
             super__Tuple_impl<0UL,_(anonymous_namespace)::Scheduler_*,_std::default_delete<(anonymous_namespace)::Scheduler>_>
             .super__Head_base<0UL,_(anonymous_namespace)::Scheduler_*,_false>._M_head_impl;
    llbuild::basic::QueueJob::QueueJob(&local_80,job);
    (*pSVar1->_vptr_Scheduler[2])(pSVar1,&local_80);
    if (local_80.work.super__Function_base._M_manager == (_Manager_type)0x0) goto LAB_001a1032;
    pQVar2 = &local_80;
    local_58.work.super__Function_base._M_manager = local_80.work.super__Function_base._M_manager;
  }
  (*local_58.work.super__Function_base._M_manager)
            ((_Any_data *)&pQVar2->work,(_Any_data *)&pQVar2->work,__destroy_functor);
LAB_001a1032:
  std::condition_variable::notify_one();
  (*((this->readyJobs)._M_t.
     super___uniq_ptr_impl<(anonymous_namespace)::Scheduler,_std::default_delete<(anonymous_namespace)::Scheduler>_>
     ._M_t.
     super__Tuple_impl<0UL,_(anonymous_namespace)::Scheduler_*,_std::default_delete<(anonymous_namespace)::Scheduler>_>
     .super__Head_base<0UL,_(anonymous_namespace)::Scheduler_*,_false>._M_head_impl)->
    _vptr_Scheduler[5])();
  pthread_mutex_unlock((pthread_mutex_t *)&this->readyJobsMutex);
  return;
}

Assistant:

virtual void addJob(QueueJob job, QueueJobPriority priority) override {
    uint64_t readyJobsCount;
    {
      std::lock_guard<std::mutex> guard(readyJobsMutex);
      if (priority == QueueJobPriority::High) {
        readyPriorityJobs.addJob(job);
      } else {
        readyJobs->addJob(job);
      }
      readyJobsCondition.notify_one();
      readyJobsCount = readyJobs->size();
    }
    TracingExecutionQueueDepth(readyJobsCount);
  }